

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SimplePolygonMesh::writeMeshObj(SimplePolygonMesh *this,ostream *out)

{
  unsigned_long uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  void *pvVar5;
  ostream *poVar6;
  reference pVVar7;
  reference pVVar8;
  reference puVar9;
  ostream *in_RSI;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *in_RDI;
  size_t ind;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *face;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range2_2;
  size_t iC;
  Vector2 c;
  iterator __end3;
  iterator __begin3;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *__range3;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *coords;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *__range2_1;
  Vector3 p;
  iterator __end2;
  iterator __begin2;
  vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *__range2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8;
  reference local_c0;
  reference local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_a8 [2];
  long local_98;
  double local_90;
  double local_88;
  Vector2 *local_80;
  __normal_iterator<geometrycentral::Vector2_*,_std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
  local_78;
  reference local_70;
  reference local_68;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *local_60;
  __normal_iterator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_*,_std::vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>_>
  local_58;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *local_50;
  double local_48;
  double local_40;
  double local_38;
  Vector3 *local_30;
  __normal_iterator<geometrycentral::Vector3_*,_std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>_>
  local_28;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *local_20;
  int local_14;
  ostream *local_10;
  
  local_10 = in_RSI;
  local_14 = (int)::std::setprecision(0x11);
  ::std::operator<<(in_RSI,(_Setprecision)local_14);
  poVar3 = ::std::operator<<(local_10,"# Mesh exported from geometry-central");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<(local_10,"#  vertices: ");
  sVar4 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::size
                    ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                     (in_RDI + 1));
  pvVar5 = (void *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::ostream::operator<<(pvVar5,::std::endl<char,std::char_traits<char>>);
  poVar6 = ::std::operator<<(local_10,"#     faces: ");
  sVar4 = ::std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)in_RDI);
  pvVar5 = (void *)::std::ostream::operator<<(poVar6,sVar4);
  ::std::ostream::operator<<(pvVar5,::std::endl<char,std::char_traits<char>>);
  ::std::ostream::operator<<(local_10,::std::endl<char,std::char_traits<char>>);
  local_20 = in_RDI + 1;
  local_28._M_current =
       (Vector3 *)
       ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::begin
                 ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                  in_RSI);
  local_30 = (Vector3 *)
             ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::end
                       ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                         *)in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<geometrycentral::Vector3_*,_std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>_>
                        *)poVar3,
                       (__normal_iterator<geometrycentral::Vector3_*,_std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>_>
                        *)in_RSI);
    if (!bVar2) break;
    pVVar7 = __gnu_cxx::
             __normal_iterator<geometrycentral::Vector3_*,_std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>_>
             ::operator*(&local_28);
    local_48 = pVVar7->x;
    local_40 = pVVar7->y;
    local_38 = pVVar7->z;
    poVar6 = ::std::operator<<(local_10,"v ");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,local_48);
    poVar6 = ::std::operator<<(poVar6," ");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,local_40);
    poVar6 = ::std::operator<<(poVar6," ");
    pvVar5 = (void *)::std::ostream::operator<<(poVar6,local_38);
    ::std::ostream::operator<<(pvVar5,::std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<geometrycentral::Vector3_*,_std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>_>
    ::operator++(&local_28);
  }
  local_50 = in_RDI + 2;
  local_58._M_current =
       (vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
       std::
       vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
       ::begin((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                *)in_RSI);
  local_60 = (vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
             std::
             vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
             ::end((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                    *)in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_*,_std::vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>_>
                        *)poVar3,
                       (__normal_iterator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_*,_std::vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>_>
                        *)in_RSI);
    if (!bVar2) break;
    local_70 = __gnu_cxx::
               __normal_iterator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_*,_std::vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>_>
               ::operator*(&local_58);
    local_68 = local_70;
    local_78._M_current =
         (Vector2 *)
         std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::begin
                   ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                    in_RSI);
    local_80 = (Vector2 *)
               std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::end
                         ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                           *)in_RSI);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<geometrycentral::Vector2_*,_std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
                          *)poVar3,
                         (__normal_iterator<geometrycentral::Vector2_*,_std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
                          *)in_RSI);
      if (!bVar2) break;
      pVVar8 = __gnu_cxx::
               __normal_iterator<geometrycentral::Vector2_*,_std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
               ::operator*(&local_78);
      local_90 = pVVar8->x;
      local_88 = pVVar8->y;
      poVar6 = ::std::operator<<(local_10,"vt ");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,local_90);
      poVar6 = ::std::operator<<(poVar6," ");
      pvVar5 = (void *)::std::ostream::operator<<(poVar6,local_88);
      ::std::ostream::operator<<(pvVar5,::std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<geometrycentral::Vector2_*,_std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>
      ::operator++(&local_78);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_*,_std::vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>_>
    ::operator++(&local_58);
  }
  local_98 = 0;
  local_a8[0]._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       ::std::
       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)in_RSI);
  local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ::std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)poVar3,
                       (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_RSI);
    if (!bVar2) break;
    local_b8 = __gnu_cxx::
               __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*(local_a8);
    ::std::operator<<(local_10,"f");
    local_c0 = local_b8;
    local_c8._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)poVar3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_RSI);
      if (!bVar2) break;
      puVar9 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_c8);
      uVar1 = *puVar9;
      poVar6 = ::std::operator<<(local_10," ");
      ::std::ostream::operator<<(poVar6,uVar1 + 1);
      bVar2 = std::
              vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
              ::empty(in_RDI);
      if (!bVar2) {
        poVar6 = ::std::operator<<(local_10,"/");
        ::std::ostream::operator<<(poVar6,local_98 + 1);
        local_98 = local_98 + 1;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_c8);
    }
    ::std::ostream::operator<<(local_10,::std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(local_a8);
  }
  return;
}

Assistant:

void SimplePolygonMesh::writeMeshObj(std::ostream& out) {

  // Make sure we write out at full precision
  out << std::setprecision(std::numeric_limits<double>::max_digits10);

  // Write header
  out << "# Mesh exported from geometry-central" << std::endl;
  out << "#  vertices: " << vertexCoordinates.size() << std::endl;
  out << "#     faces: " << polygons.size() << std::endl;
  out << std::endl;

  // Write vertices
  for (Vector3 p : vertexCoordinates) {
    out << "v " << p.x << " " << p.y << " " << p.z << std::endl;
  }


  // Write texture coords (if present)
  for (std::vector<Vector2>& coords : paramCoordinates) {
    for (Vector2 c : coords) {
      out << "vt " << c.x << " " << c.y << std::endl;
    }
  }

  // Write faces
  size_t iC = 0;
  for (std::vector<size_t>& face : polygons) {
    out << "f";
    for (size_t ind : face) {
      out << " " << (ind + 1);

      if (!paramCoordinates.empty()) {
        out << "/" << (iC + 1);
        iC++;
      }
    }
    out << std::endl;
  }
}